

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::
swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::short_string_storage>
          (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>> *this,
          basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>> *param_2)

{
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>> bVar1;
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>> bVar2;
  ulong uVar3;
  undefined4 local_3c [3];
  
  bVar1 = *param_2;
  bVar2 = param_2[1];
  uVar3 = (ulong)((byte)bVar1 >> 4);
  memcpy(local_3c,param_2 + 4,uVar3 * 4);
  local_3c[uVar3] = 0;
  *param_2 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>)
             ((byte)*this & 0xf);
  param_2[1] = this[1];
  *(undefined8 *)(param_2 + 8) = *(undefined8 *)(this + 8);
  *this = bVar1;
  this[1] = bVar2;
  memcpy(this + 4,local_3c,uVar3 * 4);
  *(undefined4 *)(this + uVar3 * 4 + 4) = 0;
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }